

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

bool __thiscall cmCPackGenerator::WantsComponentInstallation(cmCPackGenerator *this)

{
  bool bVar1;
  uint uVar2;
  byte local_5c;
  byte local_5a;
  allocator local_31;
  string local_30;
  cmCPackGenerator *local_10;
  cmCPackGenerator *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"CPACK_MONOLITHIC_INSTALL",&local_31);
  bVar1 = IsOn(this,&local_30);
  local_5a = 0;
  if (!bVar1) {
    uVar2 = (*(this->super_cmObject)._vptr_cmObject[0x17])();
    local_5a = 0;
    if ((uVar2 & 1) != 0) {
      bVar1 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
              ::empty(&this->ComponentGroups);
      local_5c = 1;
      if (bVar1) {
        bVar1 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                ::empty(&this->Components);
        local_5c = bVar1 ^ 0xff;
      }
      local_5a = local_5c;
    }
  }
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return (bool)(local_5a & 1);
}

Assistant:

bool cmCPackGenerator::WantsComponentInstallation() const
{
  return (!IsOn("CPACK_MONOLITHIC_INSTALL")
        && SupportsComponentInstallation()
        // check that we have at least one group or component
        && (!this->ComponentGroups.empty() || !this->Components.empty()));
}